

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::CacheState::getFullBarrier
          (CacheState *this,VkPipelineStageFlags *srcStages,VkAccessFlags *srcAccesses,
          VkPipelineStageFlags *dstStages,VkAccessFlags *dstAccesses)

{
  PipelineStage PVar1;
  PipelineStage PVar2;
  VkPipelineStageFlagBits local_3c;
  PipelineStage srcStage;
  VkPipelineStageFlags srcStage_;
  PipelineStage dstStage;
  VkPipelineStageFlags dstStage_;
  VkAccessFlags *dstAccesses_local;
  VkPipelineStageFlags *dstStages_local;
  VkAccessFlags *srcAccesses_local;
  VkPipelineStageFlags *srcStages_local;
  CacheState *this_local;
  
  *srcStages = 0;
  *srcAccesses = 0;
  *dstStages = 0;
  *dstAccesses = 0;
  for (srcStage_ = 1; srcStage_ <= this->m_allowedStages; srcStage_ = srcStage_ << 1) {
    PVar1 = pipelineStageFlagToPipelineStage(srcStage_);
    if ((srcStage_ & this->m_allowedStages) != 0) {
      if (this->m_incompleteOperations[PVar1] != 0) {
        *dstStages = srcStage_ | *dstStages;
        *srcStages = this->m_incompleteOperations[PVar1] | *srcStages;
      }
      if (this->m_invisibleOperations[PVar1] != 0) {
        *dstStages = srcStage_ | *dstStages;
        *dstAccesses = this->m_invisibleOperations[PVar1] | *dstAccesses;
      }
      for (local_3c = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; local_3c <= this->m_allowedStages;
          local_3c = local_3c << 1) {
        PVar2 = pipelineStageFlagToPipelineStage(local_3c);
        if ((local_3c & this->m_allowedStages) != 0) {
          if (this->m_unavailableWriteOperations[PVar1][PVar2] != 0) {
            *dstStages = srcStage_ | *dstStages;
            *srcStages = srcStage_ | *srcStages;
            *srcAccesses = this->m_unavailableWriteOperations[PVar1][PVar2] | *srcAccesses;
          }
          if (((this->m_unavailableLayoutTransition[PVar1] & 1U) != 0) &&
             ((this->m_unavailableLayoutTransition[PVar2] & 1U) == 0)) {
            *dstStages = srcStage_ | *dstStages;
            *srcStages = srcStage_ | *srcStages;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CacheState::getFullBarrier (vk::VkPipelineStageFlags&	srcStages,
								 vk::VkAccessFlags&			srcAccesses,
								 vk::VkPipelineStageFlags&	dstStages,
								 vk::VkAccessFlags&			dstAccesses) const
{
	srcStages	= 0;
	srcAccesses	= 0;
	dstStages	= 0;
	dstAccesses	= 0;

	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= m_allowedStages; dstStage_ <<= 1)
	{
		const PipelineStage dstStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

		if ((dstStage_ & m_allowedStages) == 0)
			continue;

		// Make sure all previous operation are complete in all stages
		if (m_incompleteOperations[dstStage])
		{
			dstStages |= dstStage_;
			srcStages |= m_incompleteOperations[dstStage];
		}

		// Make sure all read operations are visible in dstStage
		if (m_invisibleOperations[dstStage])
		{
			dstStages |= dstStage_;
			dstAccesses |= m_invisibleOperations[dstStage];
		}

		// Make sure all write operations fro mall stages are available
		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= m_allowedStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & m_allowedStages) == 0)
				continue;

			if (m_unavailableWriteOperations[dstStage][srcStage])
			{
				dstStages |= dstStage_;
				srcStages |= dstStage_;
				srcAccesses |= m_unavailableWriteOperations[dstStage][srcStage];
			}

			if (m_unavailableLayoutTransition[dstStage] && !m_unavailableLayoutTransition[srcStage])
			{
				// Add dependency between srcStage and dstStage if layout transition has not completed in dstStage,
				// but has completed in srcStage.
				dstStages |= dstStage_;
				srcStages |= dstStage_;
			}
		}
	}

	DE_ASSERT((srcStages & (~m_allowedStages)) == 0);
	DE_ASSERT((srcAccesses & (~m_allowedAccesses)) == 0);
	DE_ASSERT((dstStages & (~m_allowedStages)) == 0);
	DE_ASSERT((dstAccesses & (~m_allowedAccesses)) == 0);
}